

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>_>::Resize
          (TPZVec<std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>_> *this,int64_t newsize)

{
  long lVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  void *this_01;
  long lVar3;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *in_RSI;
  long in_RDI;
  ulong uVar7;
  int64_t i;
  int64_t large;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *newstore;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *in_stack_ffffffffffffff60;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *this_02;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *local_88;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *local_70;
  long local_28;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *__x;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *this_03;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    this_01 = (void *)std::ostream::operator<<(this_00,(long)in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> **)(in_RDI + 0x10)) {
    if (in_RSI == (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)0x0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar1 = *(long *)(in_RDI + 8);
      if (lVar1 != 0) {
        lVar6 = *(long *)(lVar1 + -8);
        for (lVar3 = lVar1 + lVar6 * 0x18; lVar1 != lVar3; lVar3 = lVar3 + -0x18) {
          std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::~vector
                    (in_stack_ffffffffffffff60);
        }
        operator_delete__((void *)(lVar1 + -8),lVar6 * 0x18 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RSI;
      uVar4 = SUB168(auVar2 * ZEXT816(0x18),0);
      uVar7 = uVar4 + 8;
      if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar4) {
        uVar7 = 0xffffffffffffffff;
      }
      this_03 = in_RSI;
      puVar5 = (ulong *)operator_new__(uVar7);
      *puVar5 = (ulong)in_RSI;
      __x = (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)(puVar5 + 1);
      if (in_RSI != (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)0x0) {
        local_70 = __x;
        do {
          std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::vector
                    ((vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)0x1805919);
          local_70 = local_70 + 1;
        } while (local_70 != __x + (long)in_RSI);
      }
      local_88 = this_03;
      if (*(long *)(in_RDI + 0x10) < (long)this_03) {
        local_88 = *(vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> **)(in_RDI + 0x10);
      }
      for (local_28 = 0; local_28 < (long)local_88; local_28 = local_28 + 1) {
        std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::operator=(this_03,__x);
      }
      if ((*(long *)(in_RDI + 8) != 0) && (lVar1 = *(long *)(in_RDI + 8), lVar1 != 0)) {
        this_02 = *(vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> **)(lVar1 + -8);
        for (lVar6 = lVar1 + (long)this_02 * 0x18; lVar1 != lVar6; lVar6 = lVar6 + -0x18) {
          std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::~vector(this_02);
        }
        operator_delete__((void *)(lVar1 + -8),(long)this_02 * 0x18 + 8);
      }
      *(vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> **)(in_RDI + 8) = __x;
      *(vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> **)(in_RDI + 0x10) = this_03;
      *(vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> **)(in_RDI + 0x18) = this_03;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}